

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.cpp
# Opt level: O3

void __thiscall
btSimpleBroadphase::calculateOverlappingPairs(btSimpleBroadphase *this,btDispatcher *dispatcher)

{
  undefined8 *puVar1;
  int iVar2;
  _func_int **pp_Var3;
  btBroadphasePair *pbVar4;
  btSimpleBroadphaseProxy *proxy0;
  btSimpleBroadphaseProxy *proxy1;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphasePair *pbVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 *puVar13;
  int curSize;
  int iVar14;
  btSimpleBroadphaseProxy *pbVar15;
  btSimpleBroadphaseProxy *p1;
  long lVar16;
  long lVar17;
  btSimpleBroadphaseProxy *pbVar18;
  uint uVar19;
  btBroadphasePairSortPredicate local_42;
  btBroadphasePairSortPredicate local_41;
  int local_40;
  int local_3c;
  btDispatcher *local_38;
  undefined4 extraout_var_01;
  
  if (-1 < this->m_numHandles) {
    iVar7 = this->m_LastHandleIndex;
    uVar11 = 0xffffffff;
    iVar14 = -1;
    local_38 = dispatcher;
    if (-1 < iVar7) {
      lVar16 = 0x40;
      uVar12 = 0;
      do {
        if (this->m_pHandles[uVar12].super_btBroadphaseProxy.m_clientObject != (void *)0x0) {
          if ((long)uVar12 < (long)iVar7) {
            pbVar15 = this->m_pHandles + uVar12;
            uVar11 = uVar12 & 0xffffffff;
            lVar17 = lVar16;
            do {
              if (*(long *)((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                           lVar17 + -0x1c) != 0) {
                pbVar18 = (btSimpleBroadphaseProxy *)
                          ((long)(this->m_pHandles->super_btBroadphaseProxy).m_aabbMin.m_floats +
                          lVar17 + -0x1c);
                bVar6 = aabbOverlap(pbVar15,pbVar18);
                pp_Var3 = (this->m_pairCache->super_btOverlappingPairCallback).
                          _vptr_btOverlappingPairCallback;
                if (bVar6) {
                  iVar7 = (*pp_Var3[0xd])(this->m_pairCache,pbVar15,pbVar18);
                  if (CONCAT44(extraout_var,iVar7) == 0) {
                    (*(this->m_pairCache->super_btOverlappingPairCallback).
                      _vptr_btOverlappingPairCallback[2])(this->m_pairCache,pbVar15,pbVar18);
                  }
                }
                else {
                  iVar7 = (*pp_Var3[0xe])();
                  if (((char)iVar7 == '\0') &&
                     (iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                                _vptr_btOverlappingPairCallback[0xd])
                                        (this->m_pairCache,pbVar15,pbVar18),
                     CONCAT44(extraout_var_00,iVar7) != 0)) {
                    (*(this->m_pairCache->super_btOverlappingPairCallback).
                      _vptr_btOverlappingPairCallback[3])
                              (this->m_pairCache,pbVar15,pbVar18,local_38);
                  }
                }
              }
              iVar7 = this->m_LastHandleIndex;
              lVar17 = lVar17 + 0x40;
              uVar19 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar19;
            } while ((int)uVar19 < iVar7);
            uVar11 = uVar12 & 0xffffffff;
          }
          else {
            uVar11 = uVar12 & 0xffffffff;
          }
        }
        iVar14 = (int)uVar11;
        lVar16 = lVar16 + 0x40;
        bVar6 = (long)uVar12 < (long)iVar7;
        uVar12 = uVar12 + 1;
      } while (bVar6);
    }
    this->m_LastHandleIndex = iVar14;
    if ((this->m_ownsPairCache == true) &&
       (iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback).
                  _vptr_btOverlappingPairCallback[0xe])(), (char)iVar7 != '\0')) {
      iVar7 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
                [7])();
      this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var_01,iVar7);
      uVar19 = this_00->m_size;
      if (1 < (int)uVar19) {
        btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                  (this_00,&local_41,0,uVar19 - 1);
        uVar19 = this_00->m_size;
      }
      lVar16 = (long)this->m_invalidPair;
      iVar7 = uVar19 - this->m_invalidPair;
      if (lVar16 < 0) {
        if (this_00->m_capacity < iVar7) {
          if (iVar7 == 0) {
            pbVar9 = (btBroadphasePair *)0x0;
            uVar8 = uVar19;
          }
          else {
            pbVar9 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar7 << 5,0x10);
            uVar8 = this_00->m_size;
          }
          if (0 < (int)uVar8) {
            lVar17 = 0;
            do {
              pbVar4 = this_00->m_data;
              puVar13 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar17);
              uVar5 = puVar13[1];
              puVar1 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar17);
              *puVar1 = *puVar13;
              puVar1[1] = uVar5;
              *(undefined8 *)((long)&pbVar9->m_algorithm + lVar17) =
                   *(undefined8 *)((long)&pbVar4->m_algorithm + lVar17);
              *(undefined8 *)((long)&pbVar9->field_3 + lVar17) =
                   *(undefined8 *)((long)&pbVar4->field_3 + lVar17);
              lVar17 = lVar17 + 0x20;
            } while ((ulong)uVar8 << 5 != lVar17);
          }
          if ((this_00->m_data != (btBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_ownsMemory = true;
          this_00->m_data = pbVar9;
          this_00->m_capacity = iVar7;
        }
        lVar17 = (long)(int)uVar19 << 5;
        do {
          pbVar9 = this_00->m_data;
          puVar13 = (undefined8 *)((long)&pbVar9->m_algorithm + lVar17);
          *puVar13 = 0;
          puVar13[1] = 0;
          puVar13 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar17);
          *puVar13 = 0;
          puVar13[1] = 0;
          lVar17 = lVar17 + 0x20;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0);
      }
      this_00->m_size = iVar7;
      this->m_invalidPair = 0;
      if (0 < iVar7) {
        lVar16 = 0;
        local_40 = 0;
        lVar17 = 0;
        pbVar15 = (btSimpleBroadphaseProxy *)0x0;
        pbVar18 = (btSimpleBroadphaseProxy *)0x0;
        do {
          pbVar9 = this_00->m_data;
          proxy0 = *(btSimpleBroadphaseProxy **)((long)&pbVar9->m_pProxy0 + lVar16);
          proxy1 = *(btSimpleBroadphaseProxy **)((long)&pbVar9->m_pProxy1 + lVar16);
          if ((pbVar18 == proxy1 && pbVar15 == proxy0) ||
             (local_3c = iVar7, bVar6 = aabbOverlap(proxy0,proxy1), iVar7 = local_3c, !bVar6)) {
            puVar13 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar16);
            (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
              [8])(this->m_pairCache,puVar13,local_38);
            *puVar13 = 0;
            puVar13[1] = 0;
            local_40 = this->m_invalidPair + 1;
            this->m_invalidPair = local_40;
            gOverlappingPairs = gOverlappingPairs + -1;
            iVar7 = this_00->m_size;
          }
          lVar17 = lVar17 + 1;
          lVar16 = lVar16 + 0x20;
          pbVar15 = proxy0;
          pbVar18 = proxy1;
        } while (lVar17 < iVar7);
        iVar14 = local_40;
        iVar10 = iVar7;
        if (1 < iVar7) {
          btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                    (this_00,&local_42,0,iVar7 + -1);
          iVar14 = this->m_invalidPair;
          iVar10 = this_00->m_size;
        }
        iVar7 = iVar10 - iVar14;
        if (iVar14 < 0) {
          if (this_00->m_capacity < iVar7) {
            if (iVar10 == iVar14) {
              pbVar9 = (btBroadphasePair *)0x0;
            }
            else {
              pbVar9 = (btBroadphasePair *)btAlignedAllocInternal((long)iVar7 << 5,0x10);
              iVar2 = this_00->m_size;
              if (0 < (long)iVar2) {
                lVar16 = 0;
                do {
                  pbVar4 = this_00->m_data;
                  puVar13 = (undefined8 *)((long)&pbVar4->m_pProxy0 + lVar16);
                  uVar5 = puVar13[1];
                  puVar1 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar16);
                  *puVar1 = *puVar13;
                  puVar1[1] = uVar5;
                  *(undefined8 *)((long)&pbVar9->m_algorithm + lVar16) =
                       *(undefined8 *)((long)&pbVar4->m_algorithm + lVar16);
                  *(undefined8 *)((long)&pbVar9->field_3 + lVar16) =
                       *(undefined8 *)((long)&pbVar4->field_3 + lVar16);
                  lVar16 = lVar16 + 0x20;
                } while ((long)iVar2 * 0x20 != lVar16);
              }
            }
            if ((this_00->m_data != (btBroadphasePair *)0x0) && (this_00->m_ownsMemory == true)) {
              btAlignedFreeInternal(this_00->m_data);
            }
            this_00->m_ownsMemory = true;
            this_00->m_data = pbVar9;
            this_00->m_capacity = iVar7;
          }
          lVar17 = (long)iVar14;
          lVar16 = (long)iVar10 << 5;
          do {
            pbVar9 = this_00->m_data;
            puVar13 = (undefined8 *)((long)&pbVar9->m_algorithm + lVar16);
            *puVar13 = 0;
            puVar13[1] = 0;
            puVar13 = (undefined8 *)((long)&pbVar9->m_pProxy0 + lVar16);
            *puVar13 = 0;
            puVar13[1] = 0;
            lVar16 = lVar16 + 0x20;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0);
        }
      }
      this_00->m_size = iVar7;
      this->m_invalidPair = 0;
    }
  }
  return;
}

Assistant:

void	btSimpleBroadphase::calculateOverlappingPairs(btDispatcher* dispatcher)
{
	//first check for new overlapping pairs
	int i,j;
	if (m_numHandles >= 0)
	{
		int new_largest_index = -1;
		for (i=0; i <= m_LastHandleIndex; i++)
		{
			btSimpleBroadphaseProxy* proxy0 = &m_pHandles[i];
			if(!proxy0->m_clientObject)
			{
				continue;
			}
			new_largest_index = i;
			for (j=i+1; j <= m_LastHandleIndex; j++)
			{
				btSimpleBroadphaseProxy* proxy1 = &m_pHandles[j];
				btAssert(proxy0 != proxy1);
				if(!proxy1->m_clientObject)
				{
					continue;
				}

				btSimpleBroadphaseProxy* p0 = getSimpleProxyFromProxy(proxy0);
				btSimpleBroadphaseProxy* p1 = getSimpleProxyFromProxy(proxy1);

				if (aabbOverlap(p0,p1))
				{
					if ( !m_pairCache->findPair(proxy0,proxy1))
					{
						m_pairCache->addOverlappingPair(proxy0,proxy1);
					}
				} else
				{
					if (!m_pairCache->hasDeferredRemoval())
					{
						if ( m_pairCache->findPair(proxy0,proxy1))
						{
							m_pairCache->removeOverlappingPair(proxy0,proxy1,dispatcher);
						}
					}
				}
			}
		}

		m_LastHandleIndex = new_largest_index;

		if (m_ownsPairCache && m_pairCache->hasDeferredRemoval())
		{

			btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

			//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;


			btBroadphasePair previousPair;
			previousPair.m_pProxy0 = 0;
			previousPair.m_pProxy1 = 0;
			previousPair.m_algorithm = 0;


			for (i=0;i<overlappingPairArray.size();i++)
			{

				btBroadphasePair& pair = overlappingPairArray[i];

				bool isDuplicate = (pair == previousPair);

				previousPair = pair;

				bool needsRemoval = false;

				if (!isDuplicate)
				{
					bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

					if (hasOverlap)
					{
						needsRemoval = false;//callback->processOverlap(pair);
					} else
					{
						needsRemoval = true;
					}
				} else
				{
					//remove duplicate
					needsRemoval = true;
					//should have no algorithm
					btAssert(!pair.m_algorithm);
				}

				if (needsRemoval)
				{
					m_pairCache->cleanOverlappingPair(pair,dispatcher);

					//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
					//		m_overlappingPairArray.pop_back();
					pair.m_pProxy0 = 0;
					pair.m_pProxy1 = 0;
					m_invalidPair++;
					gOverlappingPairs--;
				} 

			}

			///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

			//perform a sort, to sort 'invalid' pairs to the end
			overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

			overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
			m_invalidPair = 0;
#endif//CLEAN_INVALID_PAIRS

		}
	}
}